

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

int32_t binarySearch(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  do {
    while( true ) {
      if (lenarray <= (int)uVar4) {
        return ~uVar4;
      }
      uVar1 = uVar4 + (lenarray - 1U);
      uVar3 = uVar1 >> 1;
      uVar2 = *(ushort *)((long)array + (ulong)(uVar1 & 0xfffffffe));
      if (ikey <= uVar2) break;
      uVar4 = uVar3 + 1;
    }
    lenarray = uVar3;
  } while (ikey < uVar2);
  return uVar3;
}

Assistant:

inline int32_t binarySearch(const uint16_t *array, int32_t lenarray,
                            uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex];
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}